

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayops.c
# Opt level: O3

LispPTR N_OP_aset1(LispPTR data,LispPTR arrayarg,LispPTR inx)

{
  DLword *pDVar1;
  DLword *pDVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  byte *pbVar9;
  
  if ((*(ushort *)((ulong)(arrayarg >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 0xe) {
    MachineState.tosvalue = inx;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  uVar5 = (ulong)data;
  if ((arrayarg & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)arrayarg);
  }
  pDVar1 = Lisp_world;
  if ((inx & 0xfff0000) == 0xe0000) {
    uVar8 = inx & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(inx >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    if ((inx & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)inx);
    }
    uVar8 = *(uint *)(Lisp_world + inx);
    if ((int)uVar8 < 0) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  pDVar2 = MDStypetbl;
  if (*(int *)(pDVar1 + (ulong)arrayarg + 6) <= (int)uVar8) {
    MachineState.tosvalue = inx;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  uVar8 = uVar8 + pDVar1[(ulong)arrayarg + 2];
  uVar4 = *(uint *)(pDVar1 + arrayarg);
  uVar7 = (ulong)(uVar4 & 0xfffffff);
  bVar3 = (byte)pDVar1[(ulong)arrayarg + 3];
  uVar6 = data >> 8;
  if (bVar3 < 0x26) {
    if (bVar3 < 4) {
      if (bVar3 != 0) {
        if (bVar3 != 3) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        if ((data & 0xfff0000) == 0xe0000) {
          uVar4 = data & 0xffff;
        }
        else {
          if ((*(ushort *)((ulong)(uVar6 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
            MachineState.tosvalue = inx;
            MachineState.errorexit = 1;
            return 0xffffffff;
          }
          if ((data & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar5);
          }
          uVar4 = *(uint *)(Lisp_world + uVar5);
          if ((int)uVar4 < 0) {
            MachineState.tosvalue = inx;
            MachineState.errorexit = 1;
            return 0xffffffff;
          }
        }
        if (0xff < uVar4) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        *(char *)((long)Lisp_world + (ulong)uVar8 + uVar7 * 2 ^ 3) = (char)uVar4;
        return data;
      }
      if ((data & 0xfff0000) == 0xe0000) {
        uVar6 = data & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(uVar6 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        if ((data & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar5);
        }
        uVar6 = *(uint *)(Lisp_world + uVar5);
        if ((int)uVar6 < 0) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
      }
      if (1 < uVar6) {
        MachineState.errorexit = 1;
        MachineState.tosvalue = inx;
        return 0xffffffff;
      }
      pbVar9 = (byte *)((long)Lisp_world + (ulong)(uVar8 >> 3) + (ulong)(uVar4 & 0xfffffff) * 2 ^ 3)
      ;
      bVar3 = *pbVar9;
      if (uVar6 == 0) {
        bVar3 = bVar3 & (char)(-1 << (~(byte)uVar8 & 7)) - 1U;
      }
      else {
        bVar3 = bVar3 | (byte)(1 << (~(byte)uVar8 & 7));
      }
      *pbVar9 = bVar3;
      return data;
    }
    if (bVar3 == 4) {
      if ((data & 0xfff0000) != 0xe0000) {
        if ((*(ushort *)((ulong)(uVar6 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        if ((data & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar5);
        }
        uVar4 = *(uint *)(Lisp_world + uVar5);
        uVar5 = (ulong)uVar4;
        if ((int)uVar4 < 0) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        if (0xffff < uVar4) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
      }
      *(short *)((ulong)(Lisp_world + uVar7 + uVar8) ^ 2) = (short)uVar5;
      return data;
    }
    if (bVar3 == 0x14) {
      if (((data & 0xfff8000) != 0xf8000) && ((data & 0xfff8000) != 0xe0000)) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
LAB_0010993f:
      *(short *)((ulong)(Lisp_world + uVar7 + uVar8) ^ 2) = (short)data;
      return data;
    }
    if (bVar3 != 0x16) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    if ((data & 0xfff0000) == 0xf0000) {
      uVar6 = data | 0xffff0000;
      goto LAB_00109b0e;
    }
    if ((data & 0xfff0000) == 0xe0000) {
      uVar6 = data & 0xffff;
      goto LAB_00109b0e;
    }
    if ((*(ushort *)((ulong)(uVar6 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  else {
    if (0x42 < bVar3) {
      if (bVar3 == 0x43) {
        if ((data & 0xfff0000) != 0x70000) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        if ((data & 0xff00) != 0) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        *(char *)((long)Lisp_world + (ulong)uVar8 + uVar7 * 2 ^ 3) = (char)data;
        return data;
      }
      if (bVar3 != 0x44) {
        if (bVar3 != 0x56) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        if ((uVar4 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
        }
        *(LispPTR *)(Lisp_world + uVar7 + (ulong)uVar8 * 2) = data;
        return data;
      }
      if ((data & 0xfff0000) != 0x70000) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      goto LAB_0010993f;
    }
    if (bVar3 == 0x26) {
      if ((uVar4 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
      }
      uVar5 = (ulong)uVar8;
      uVar8 = *(uint *)(Lisp_world + uVar7 + uVar5 * 2);
      if ((-1 < *(short *)((ulong)(pDVar2 + (uVar8 >> 9)) ^ 2)) && (*GcDisabled_word != 0x4c)) {
        if (*Reclaim_cnt_word == 0) {
          if ((uVar4 & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
            uVar8 = *(uint *)(Lisp_world + uVar7 + uVar5 * 2);
          }
          rec_htfind(uVar8,1);
        }
        else {
          if ((uVar4 & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
            uVar8 = *(uint *)(Lisp_world + uVar7 + uVar5 * 2);
          }
          htfind(uVar8,1);
        }
      }
      if ((-1 < *(short *)((ulong)(uVar6 & 0xfffffe) + (long)MDStypetbl ^ 2)) &&
         (*GcDisabled_word != 0x4c)) {
        if (*Reclaim_cnt_word == 0) {
          rec_htfind(data,0);
        }
        else {
          htfind(data,0);
        }
      }
      if ((uVar4 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
      }
      *(LispPTR *)(Lisp_world + uVar7 + uVar5 * 2) = data;
      return data;
    }
    if (bVar3 != 0x36) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    if ((*(ushort *)((ulong)(uVar6 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 3) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  if ((data & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar5);
  }
  uVar6 = *(uint *)(Lisp_world + uVar5);
LAB_00109b0e:
  if ((uVar4 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
  }
  *(uint *)(Lisp_world + uVar7 + (ulong)uVar8 * 2) = uVar6;
  return data;
}

Assistant:

LispPTR N_OP_aset1(LispPTR data, LispPTR arrayarg, LispPTR inx) {
  OneDArray *arrayblk;
  LispPTR base;
  int index;

  /*  verify array  */
  if (GetTypeNumber(arrayarg) != TYPE_ONED_ARRAY) ERROR_EXIT(inx);
  arrayblk = (OneDArray *)NativeAligned4FromLAddr(arrayarg);

  /*  test and setup index  */
  N_GetPos(inx, index, inx);
  if (index >= arrayblk->totalsize) ERROR_EXIT(inx);
  index += arrayblk->offset;

  /*  setup base  */
  base = arrayblk->base;

  /*  dispatch on type  */
  aset_switch(arrayblk->typenumber, inx);

doufn:
  ERROR_EXIT(inx);

}